

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v10::detail::
     for_each_codepoint<fmt::v10::detail::compute_width(fmt::v10::basic_string_view<char>)::count_code_points>
               (string_view s,count_code_points f)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  anon_class_8_1_54a39806 *unaff_retaddr;
  char *end_1;
  char *buf_ptr;
  char buf [7];
  long num_chars_left;
  char *end;
  size_t block_size;
  char *p;
  anon_class_8_1_54a39806 decode;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  char local_47 [7];
  char *local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  
  local_28 = basic_string_view<char>::data((basic_string_view<char> *)&stack0xfffffffffffffff0);
  local_30 = 4;
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&stack0xfffffffffffffff0);
  if (sVar1 < 4) {
LAB_00288837:
    pcVar2 = basic_string_view<char>::data((basic_string_view<char> *)&stack0xfffffffffffffff0);
    sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&stack0xfffffffffffffff0);
    local_40 = pcVar2 + (sVar1 - (long)local_28);
    if (local_40 != (char *)0x0) {
      memset(local_47,0,7);
      copy_str<char,_const_char,_char,_0>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      pcVar2 = local_47;
      do {
        pcVar3 = for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                           (unaff_retaddr,in_RSI,in_RDI);
        if (pcVar3 == (char *)0x0) {
          return;
        }
        local_28 = local_28 + ((long)pcVar3 - (long)pcVar2);
        pcVar2 = pcVar3;
      } while ((long)pcVar3 - (long)local_47 < (long)local_40);
    }
  }
  else {
    in_stack_ffffffffffffffa0 = local_28;
    sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&stack0xfffffffffffffff0);
    local_38 = in_stack_ffffffffffffffa0 + (sVar1 - 3);
    do {
      if (local_38 <= local_28) goto LAB_00288837;
      local_28 = for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                           (unaff_retaddr,in_RSI,in_RDI);
    } while (local_28 != (char *)0x0);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, error ? 1 : to_unsigned(end - buf_ptr)));
    return result ? (error ? buf_ptr + 1 : end) : nullptr;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    const char* buf_ptr = buf;
    do {
      auto end = decode(buf_ptr, p);
      if (!end) return;
      p += end - buf_ptr;
      buf_ptr = end;
    } while (buf_ptr - buf < num_chars_left);
  }
}